

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall IteratorTest::comparisonOperators<false>(IteratorTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  bool bVar3;
  reference pvVar4;
  iterator iVar5;
  iterator iVar6;
  difference_type dVar7;
  difference_type dVar8;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar9;
  reference piVar10;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar11;
  reference piVar12;
  bool local_2171;
  bool local_215b;
  bool local_2121;
  bool local_210b;
  bool local_20d1;
  bool local_20bb;
  bool local_1fe6;
  bool local_1fe5;
  int local_1fe4;
  undefined1 local_1fe0 [4];
  int i_26;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1fb0;
  iterator local_1f80;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1f50;
  undefined1 local_1f20 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_20;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_20;
  undefined1 local_1ea8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_20;
  undefined1 local_1e60 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_20;
  undefined1 local_1e40 [4];
  int i_25;
  const_iterator local_1e10;
  undefined1 local_1de0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_19;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_19;
  undefined1 local_1d68 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_19;
  undefined1 local_1d20 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_19;
  undefined1 local_1d00 [4];
  int i_24;
  iterator local_1cd0;
  undefined1 local_1ca0 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2_18;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1_18;
  undefined1 local_1c28 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_18;
  undefined1 local_1be0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_18;
  undefined1 local_1bc0 [4];
  int i_23;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1b90;
  iterator local_1b60;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1b30;
  undefined1 local_1b00 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_17;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_17;
  undefined1 local_1a88 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_17;
  undefined1 local_1a40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_17;
  undefined1 local_1a20 [4];
  int i_22;
  const_iterator local_19f0;
  undefined1 local_19c0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_16;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_16;
  undefined1 local_1948 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_16;
  undefined1 local_1900 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_16;
  undefined1 local_18e0 [4];
  int i_21;
  iterator local_18b0;
  undefined1 local_1880 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2_15;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1_15;
  undefined1 local_1808 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_15;
  undefined1 local_17c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_15;
  undefined1 local_17a0 [4];
  int i_20;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1770;
  iterator local_1740;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1710;
  undefined1 local_16e0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_14;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_14;
  undefined1 local_1668 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_14;
  undefined1 local_1620 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_14;
  undefined1 local_1600 [4];
  int i_19;
  const_iterator local_15d0;
  undefined1 local_15a0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_13;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_13;
  undefined1 local_1528 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_13;
  undefined1 local_14e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_13;
  undefined1 local_14c0 [4];
  int i_18;
  iterator local_1490;
  undefined1 local_1460 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2_12;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1_12;
  undefined1 local_13e8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_12;
  undefined1 local_13a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_12;
  undefined1 local_1380 [4];
  int i_17;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1350;
  iterator local_1320;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_12f0;
  undefined1 local_12c0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_11;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_11;
  undefined1 local_1248 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_11;
  undefined1 local_1200 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_11;
  undefined1 local_11e0 [4];
  int i_16;
  const_iterator local_11b0;
  undefined1 local_1180 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_10;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_10;
  undefined1 local_1108 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_10c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_10;
  undefined1 local_10a0 [4];
  int i_15;
  iterator local_1070;
  undefined1 local_1040 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2_9;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1_9;
  undefined1 local_fc8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_f80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  undefined1 local_f60 [4];
  int i_14;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_f30;
  iterator local_f00;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_ed0;
  undefined1 local_ea0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_8;
  undefined1 local_e28 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_de0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  undefined1 local_dc0 [4];
  int i_13;
  const_iterator local_d90;
  undefined1 local_d60 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_7;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_7;
  undefined1 local_ce8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_ca0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  undefined1 local_c80 [4];
  int i_12;
  iterator local_c50;
  undefined1 local_c20 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2_6;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1_6;
  undefined1 local_ba8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_b60 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  iterator local_b40;
  iterator local_b10;
  bool local_ade;
  bool local_add;
  int local_adc;
  undefined1 local_ad8 [4];
  int i_11;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_aa8;
  iterator local_a78;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_a48;
  undefined1 local_a18 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_5;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_5;
  undefined1 local_9a0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_958 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  const_iterator local_938;
  const_iterator local_908;
  bool local_8d6;
  bool local_8d5;
  int local_8d4;
  undefined1 local_8d0 [4];
  int i_10;
  const_iterator local_8a0;
  undefined1 local_870 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_4;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_4;
  undefined1 local_7f8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_7b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  iterator local_790;
  iterator local_760;
  bool local_72e;
  bool local_72d;
  int local_72c;
  undefined1 local_728 [4];
  int i_9;
  iterator local_6f8;
  undefined1 local_6c8 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2_3;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1_3;
  undefined1 local_650 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_608 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  undefined1 local_5e8 [4];
  int i_8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_5b8;
  iterator local_588;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_558;
  bool local_525;
  int local_524;
  bool local_51d;
  int i_7;
  undefined1 local_518 [4];
  int i_6;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_4e8;
  iterator local_4b8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_488;
  undefined1 local_458 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_2;
  undefined1 local_3e0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_398 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  undefined1 local_378 [4];
  int i_5;
  const_iterator local_348;
  bool local_315;
  int local_314;
  bool local_30d;
  int i_4;
  undefined1 local_308 [4];
  int i_3;
  const_iterator local_2d8;
  undefined1 local_2a8 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2_1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1_1;
  undefined1 local_230 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_1e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  undefined1 local_1c8 [4];
  int i_2;
  iterator local_198;
  bool local_165;
  int local_164;
  bool local_15d;
  int i_1;
  undefined1 local_158 [4];
  int i;
  iterator local_128;
  undefined1 local_f8 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  IteratorTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&it1.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_128,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_128);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_128);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_158,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
  for (i_1 = 0; i_1 < 0x18; i_1 = i_1 + 1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
               &it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  dVar7 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)
                     &it2.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_15d = dVar7 == 0x18;
  test(&local_15d);
  for (local_164 = 0; local_164 < 0x18; local_164 = local_164 + 1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  }
  dVar7 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)
                     &it2.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_165 = dVar7 == 0;
  test(&local_165);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_198,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_198);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_198);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_1c8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  for (shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x18;
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  }
  dVar7 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)
                     &it2.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = dVar7 == -0x18;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
  paVar1 = (allocator<int> *)
           ((long)&it1_1.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_230,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_1.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_2d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_230);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_2d8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_308,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_230);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_308);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_308);
  for (i_4 = 0; i_4 < 0x18; i_4 = i_4 + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  dVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_1.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
  local_30d = dVar8 == 0x18;
  test(&local_30d);
  for (local_314 = 0; local_314 < 0x18; local_314 = local_314 + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
  }
  dVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_1.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
  local_315 = dVar8 == 0;
  test(&local_315);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_348,(View<int,_true,_std::allocator<unsigned_long>_> *)local_230);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_348);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_348);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_378,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_230);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_378);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_378);
  for (shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x18;
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
  }
  dVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_1.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = dVar8 == -0x18;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_230);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_398,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_398,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_398);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_398);
  paVar1 = (allocator<int> *)
           ((long)&it1_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_3e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_4b8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_3e0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_488,&local_4b8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_488);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_488);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_4b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_518,(View<int,_false,_std::allocator<unsigned_long>_> *)local_3e0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_4e8,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_518);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458,&local_4e8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_4e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_518);
  for (i_7 = 0; i_7 < 0x18; i_7 = i_7 + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  dVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_2.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458);
  local_51d = dVar8 == 0x18;
  test(&local_51d);
  for (local_524 = 0; local_524 < 0x18; local_524 = local_524 + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458);
  }
  dVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_2.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458);
  local_525 = dVar8 == 0;
  test(&local_525);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_588,(View<int,_false,_std::allocator<unsigned_long>_> *)local_3e0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_558,&local_588);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_558);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_558);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_588);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_5e8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_3e0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_5b8,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_5e8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458,&local_5b8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_5b8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_5e8);
  for (shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x18;
      shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458);
  }
  dVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_2.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458);
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = dVar8 == -0x18;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_458);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_3e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_398);
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608);
  paVar1 = (allocator<int> *)
           ((long)&it1_3.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_650,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_3.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_6f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_6f8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_6f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_728,(View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6c8,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_728);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_728);
  for (local_72c = 0; local_72c < 0x18; local_72c = local_72c + 1) {
    local_72d = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                          ((Iterator<int,false,std::allocator<unsigned_long>> *)
                           &it2_3.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6c8);
    test(&local_72d);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
               &it2_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6c8);
  }
  shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_760,(View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
  bVar3 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)
                     &it2_3.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_760);
  local_20bb = false;
  if (bVar3) {
    andres::View<int,_false,_std::allocator<unsigned_long>_>::end
              (&local_790,(View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
    shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    local_20bb = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                           ((Iterator<int,false,std::allocator<unsigned_long>> *)local_6c8,
                            &local_790);
  }
  local_72e = local_20bb;
  test(&local_72e);
  if ((shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_790);
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_760);
  pIVar9 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                      &it2_3.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  piVar10 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar9);
  local_20d1 = false;
  if (*piVar10 == 0x2e) {
    pIVar9 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6c8);
    piVar10 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar9);
    local_20d1 = *piVar10 == 0x2e;
  }
  shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_20d1;
  test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6c8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608);
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
  paVar1 = (allocator<int> *)
           ((long)&it1_4.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_7f8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_4.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_4.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_870);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_8a0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_7f8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_4.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8a0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_8a0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_8d0,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_7f8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_870,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_8d0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_8d0);
  for (local_8d4 = 0; local_8d4 < 0x18; local_8d4 = local_8d4 + 1) {
    local_8d5 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                          ((Iterator<int,true,std::allocator<unsigned_long>> *)
                           &it2_4.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_870);
    test(&local_8d5);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_4.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_870);
  }
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_908,(View<int,_true,_std::allocator<unsigned_long>_> *)local_7f8);
  bVar3 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_4.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_908);
  local_210b = false;
  if (bVar3) {
    andres::View<int,_true,_std::allocator<unsigned_long>_>::end
              (&local_938,(View<int,_true,_std::allocator<unsigned_long>_> *)local_7f8);
    shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    local_210b = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                           ((Iterator<int,true,std::allocator<unsigned_long>> *)local_870,&local_938
                           );
  }
  local_8d6 = local_210b;
  test(&local_8d6);
  if ((shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_938);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_908);
  pIVar11 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                       &it2_4.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  piVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar11);
  local_2121 = false;
  if (*piVar12 == 0x2e) {
    pIVar11 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_870);
    piVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar11);
    local_2121 = *piVar12 == 0x2e;
  }
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_2121;
  test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_870);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_4.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_7f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
  puVar2 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  paVar1 = (allocator<int> *)
           ((long)&it1_5.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_9a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_5.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_5.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a18);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_a78,(View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_a48,&local_a78);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_5.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a48);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_a48);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_a78);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_ad8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_aa8,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_ad8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a18,&local_aa8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_aa8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_ad8);
  for (local_adc = 0; local_adc < 0x18; local_adc = local_adc + 1) {
    local_add = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                          ((Iterator<int,true,std::allocator<unsigned_long>> *)
                           &it2_5.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a18);
    test(&local_add);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_5.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a18);
  }
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_b10,(View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
  bVar3 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)
                     &it2_5.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_b10);
  local_215b = false;
  if (bVar3) {
    andres::View<int,_false,_std::allocator<unsigned_long>_>::end
              (&local_b40,(View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
    shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    local_215b = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                           ((Iterator<int,true,std::allocator<unsigned_long>> *)local_a18,&local_b40
                           );
  }
  local_ade = local_215b;
  test(&local_ade);
  if ((shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_b40);
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_b10);
  pIVar11 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                       &it2_5.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  piVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar11);
  local_2171 = false;
  if (*piVar12 == 0x2e) {
    pIVar11 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a18);
    piVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar11);
    local_2171 = *piVar12 == 0x2e;
  }
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_2171;
  test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a18);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_5.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b60,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b60,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b60);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b60);
  paVar1 = (allocator<int> *)
           ((long)&it1_6.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_ba8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_6.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_6.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c20);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_c50,(View<int,_false,_std::allocator<unsigned_long>_> *)local_ba8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_6.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_c50);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_c50);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_c80,(View<int,_false,_std::allocator<unsigned_long>_> *)local_ba8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c20,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c80);
  for (shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
               &it2_6.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator!=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)
                    &it2_6.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c20);
    test((bool *)((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c20);
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c20);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_6.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_ba8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b60);
  puVar2 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ca0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ca0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ca0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ca0);
  paVar1 = (allocator<int> *)
           ((long)&it1_7.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_ce8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_7.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_7.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_d60);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_d90,(View<int,_true,_std::allocator<unsigned_long>_> *)local_ce8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_7.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d90);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_d90);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_dc0,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_ce8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_d60,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0);
  for (shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_7.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator!=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_7.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_d60);
    test((bool *)((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_d60);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_d60);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_7.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_ce8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ca0);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de0);
  paVar1 = (allocator<int> *)
           ((long)&it1_8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_e28,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ea0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_f00,(View<int,_false,_std::allocator<unsigned_long>_> *)local_e28);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_ed0,&local_f00);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_ed0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_ed0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_f00);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_f60,(View<int,_false,_std::allocator<unsigned_long>_> *)local_e28);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_f30,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f60);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ea0,&local_f30);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_f30);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f60);
  for (shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator!=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ea0);
    test((bool *)((long)&shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ea0);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ea0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de0);
  puVar2 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80);
  paVar1 = (allocator<int> *)
           ((long)&it1_9.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_fc8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_9.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_9.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1040);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1070,(View<int,_false,_std::allocator<unsigned_long>_> *)local_fc8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_9.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1070);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1070);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_10a0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_fc8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1040,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_10a0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_10a0);
  for (shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1040);
    shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator<
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)
                    &it2_9.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1040);
    test((bool *)((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
               &it2_9.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1040);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_9.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_fc8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80);
  puVar2 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10c0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10c0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10c0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10c0);
  paVar1 = (allocator<int> *)
           ((long)&it1_10.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1108,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_10.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_10.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1180);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_11b0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1108);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_10.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_11b0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_11b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_11e0,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1108);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1180,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11e0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11e0);
  for (shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1180);
    shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_10.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1180);
    test((bool *)((long)&shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_10.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1180);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_10.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1108);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10c0);
  puVar2 = &v_11.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1200,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_11.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1200,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1200);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1200);
  paVar1 = (allocator<int> *)
           ((long)&it1_11.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1248,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_11.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_11.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_12c0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1320,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1248);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_12f0,&local_1320);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_11.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_12f0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_12f0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1320);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_1380,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1248);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1350,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1380);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_12c0,&local_1350);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1350);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1380);
  for (shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_12c0);
    shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_11.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_12c0);
    test((bool *)((long)&shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_11.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_12c0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_11.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1248);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1200);
  puVar2 = &v_12.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13a0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_12.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13a0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13a0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13a0);
  paVar1 = (allocator<int> *)
           ((long)&it1_12.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_13e8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_12.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_12.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1460);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1490,(View<int,_false,_std::allocator<unsigned_long>_> *)local_13e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_12.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1490);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1490);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_14c0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_13e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1460,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_14c0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_14c0);
  for (shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
               &it2_12.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator>
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)
                    &it2_12.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1460);
    test((bool *)((long)&shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1460);
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1460);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_12.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_13e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13a0);
  puVar2 = &v_13.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14e0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_13.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14e0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14e0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14e0);
  paVar1 = (allocator<int> *)
           ((long)&it1_13.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1528,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_13.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_13.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15a0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_15d0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1528);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_13.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_15d0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_15d0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_1600,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1528);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15a0,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1600);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1600);
  for (shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_13.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_13.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15a0);
    test((bool *)((long)&shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15a0);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15a0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_13.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1528);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14e0);
  puVar2 = &v_14.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1620,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_14.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1620,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1620);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1620);
  paVar1 = (allocator<int> *)
           ((long)&it1_14.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1668,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_14.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_14.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_16e0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1740,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1668);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_1710,&local_1740);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_14.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1710);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1710);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1740);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_17a0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1668);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1770,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_17a0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_16e0,&local_1770);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1770);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_17a0);
  for (shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_14.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_14.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_16e0);
    test((bool *)((long)&shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_16e0);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_16e0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_14.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1668);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1620);
  puVar2 = &v_15.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_17c0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_15.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_17c0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_17c0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_17c0);
  paVar1 = (allocator<int> *)
           ((long)&it1_15.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1808,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_15.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_15.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1880);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_18b0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1808);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_15.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_18b0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_18b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_18e0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1808);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1880,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_18e0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_18e0);
  for (shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)
                    &it2_15.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1880);
    test((bool *)((long)&shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1880);
    shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)
                    &it2_15.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1880);
    test((bool *)((long)&shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
               &it2_15.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1880);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_15.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1808);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_17c0);
  puVar2 = &v_16.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1900,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_16.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1900,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1900);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1900);
  paVar1 = (allocator<int> *)
           ((long)&it1_16.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1948,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_16.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_16.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_19c0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_19f0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1948);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_16.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_19f0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_19f0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_1a20,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1948);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_19c0,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1a20);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1a20);
  for (shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_16.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_19c0);
    test((bool *)((long)&shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_19c0);
    shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_16.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_19c0);
    test((bool *)((long)&shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_16.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_19c0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_16.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1948);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1900);
  puVar2 = &v_17.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a40,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_17.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a40,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a40);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a40);
  paVar1 = (allocator<int> *)
           ((long)&it1_17.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1a88,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_17.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_17.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1b00);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1b60,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1a88);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_1b30,&local_1b60);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_17.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b30);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1b30);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1b60);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_1bc0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1a88);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1b90,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1bc0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1b00,&local_1b90);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1b90);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1bc0);
  for (shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_17.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1b00);
    test((bool *)((long)&shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1b00);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_17.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1b00);
    test((bool *)((long)&shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_17.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1b00);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_17.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1a88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a40);
  puVar2 = &v_18.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1be0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_18.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1be0,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1be0);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1be0);
  paVar1 = (allocator<int> *)
           ((long)&it1_18.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1c28,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_18.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_18.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1ca0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1cd0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c28);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_18.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1cd0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1cd0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_1d00,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c28);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1ca0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1d00);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1d00);
  for (shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)
                    &it2_18.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1ca0);
    test((bool *)((long)&shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
               &it2_18.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)
                    &it2_18.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1ca0);
    test((bool *)((long)&shape_19.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1ca0);
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1ca0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &it2_18.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1be0);
  puVar2 = &v_19.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d20,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_19.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d20,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d20);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d20);
  paVar1 = (allocator<int> *)
           ((long)&it1_19.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1d68,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_19.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_19.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1de0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_1e10,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1d68);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_19.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e10);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1e10);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_1e40,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1d68);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1de0,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e40);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e40);
  for (shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x17;
      shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_19.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1de0);
    test((bool *)((long)&shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_19.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)
                    &it2_19.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1de0);
    test((bool *)((long)&shape_20.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1de0);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1de0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_19.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d20);
  puVar2 = &v_20.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e60,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_20.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e60,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e60);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e60);
  paVar1 = (allocator<int> *)
           ((long)&it1_20.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1ea8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it1_20.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_20.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f20);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1f80,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1ea8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_1f50,&local_1f80);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_20.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1f50);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1f50);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1f80);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_1fe0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1ea8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1fb0,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1fe0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f20,&local_1fb0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1fb0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1fe0);
  for (local_1fe4 = 0; local_1fe4 < 0x17; local_1fe4 = local_1fe4 + 1) {
    local_1fe5 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                           ((Iterator<int,true,std::allocator<unsigned_long>> *)
                            &it2_20.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f20);
    test(&local_1fe5);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
               &it2_20.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_1fe6 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                           ((Iterator<int,true,std::allocator<unsigned_long>> *)
                            &it2_20.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f20);
    test(&local_1fe6);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f20);
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f20);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &it2_20.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1ea8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e60);
  return;
}

Assistant:

void IteratorTest::comparisonOperators(){
    // operator-
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    // operator==
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    //operator!=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    //operator<
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    //operator>
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    //operator<=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    //operator>=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
}